

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentLocals.cpp
# Opt level: O1

void __thiscall wasm::InstrumentLocals::visitLocalSet(InstrumentLocals *this,LocalSet *curr)

{
  Index x;
  uintptr_t uVar1;
  bool bVar2;
  HeapType HVar3;
  undefined8 *puVar4;
  Expression *pEVar5;
  char *__assertion;
  uintptr_t uVar6;
  MixedArena *this_00;
  initializer_list<wasm::Expression_*> __l;
  Const *local_80;
  Const *local_78;
  Expression *local_70;
  Builder local_68;
  Builder builder;
  pointer local_50;
  Type local_48;
  Type type;
  undefined8 local_38;
  
  if (curr->value->_id == PopId) {
    return;
  }
  local_68.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>_>
       ).super_PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>.
       super_Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>.currModule
  ;
  local_48.id = (curr->value->type).id;
  bVar2 = wasm::Type::isFunction(&local_48);
  if ((bVar2) && (HVar3 = wasm::Type::getHeapType(&local_48), HVar3.id != 1)) {
    return;
  }
  bVar2 = wasm::Type::isRef(&local_48);
  if (bVar2) {
    HVar3 = wasm::Type::getHeapType(&local_48);
    if (HVar3.id == 0) {
      bVar2 = wasm::Type::isNullable(&local_48);
      if (!bVar2) goto LAB_00767b60;
      puVar4 = &set_externref;
    }
    else {
      if ((HVar3.id != 1) || (bVar2 = wasm::Type::isNullable(&local_48), !bVar2)) {
LAB_00767b60:
        handle_unreachable("TODO: general reference types",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                           ,0x86);
      }
      puVar4 = &set_funcref;
    }
    goto LAB_00767a41;
  }
  bVar2 = wasm::Type::isTuple(&curr->value->type);
  if (bVar2) {
    __assertion = "!curr->value->type.isTuple() && \"Unexpected tuple type\"";
LAB_00767b88:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                  ,0x89,"void wasm::InstrumentLocals::visitLocalSet(LocalSet *)");
  }
  if (6 < (curr->value->type).id) {
    __assertion = "curr->value->type.isBasic() && \"TODO: handle compound types\"";
    goto LAB_00767b88;
  }
  if (6 < local_48.id) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  switch(local_48.id & 0xffffffff) {
  case 0:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                       ,0x9c);
  case 1:
  case 3:
    goto switchD_00767a15_caseD_1;
  case 2:
    puVar4 = &set_i32;
    break;
  case 4:
    puVar4 = &set_f32;
    break;
  case 5:
    puVar4 = &set_f64;
    break;
  case 6:
    puVar4 = &set_v128;
    break;
  default:
    uVar6 = 0;
    local_38 = 0;
    goto LAB_00767a4c;
  }
LAB_00767a41:
  local_38 = *puVar4;
  uVar6 = puVar4[1];
LAB_00767a4c:
  x = this->id;
  this->id = x + 1;
  local_80 = Builder::makeConst<int>(&local_68,x);
  local_78 = Builder::makeConst<int>(&local_68,curr->index);
  local_70 = curr->value;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_80;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,__l,
             (allocator_type *)((long)&type.id + 7));
  uVar1 = (curr->value->type).id;
  this_00 = &(local_68.wasm)->allocator;
  pEVar5 = (Expression *)MixedArena::allocSpace(this_00,0x48,8);
  pEVar5->_id = CallId;
  (pEVar5->type).id = 0;
  *(undefined8 *)(pEVar5 + 1) = 0;
  pEVar5[1].type.id = 0;
  *(undefined8 *)(pEVar5 + 2) = 0;
  pEVar5[2].type.id = (uintptr_t)this_00;
  *(undefined8 *)(pEVar5 + 3) = 0;
  pEVar5[3].type.id = 0;
  *(undefined1 *)&pEVar5[4]._id = InvalidId;
  (pEVar5->type).id = uVar1;
  *(undefined8 *)(pEVar5 + 3) = local_38;
  pEVar5[3].type.id = uVar6;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar5 + 1),
             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
  *(undefined1 *)&pEVar5[4]._id = InvalidId;
  curr->value = pEVar5;
  if (builder.wasm != (Module *)0x0) {
    operator_delete(builder.wasm,(long)local_50 - (long)builder.wasm);
  }
switchD_00767a15_caseD_1:
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    // We don't instrument pop instructions. They are automatically deleted when
    // writing binary and generated when reading binary, so they don't work with
    // local set/get instrumentation.
    if (curr->value->is<Pop>()) {
      return;
    }

    Builder builder(*getModule());
    Name import;
    auto type = curr->value->type;
    if (type.isFunction() && type.getHeapType() != HeapType::func) {
      // FIXME: support typed function references
      return;
    }
    if (type.isRef()) {
      auto heapType = type.getHeapType();
      if (heapType == HeapType::func && type.isNullable()) {
        import = set_funcref;
      } else if (heapType == HeapType::ext && type.isNullable()) {
        import = set_externref;
      } else {
        WASM_UNREACHABLE("TODO: general reference types");
      }
    } else {
      TODO_SINGLE_COMPOUND(curr->value->type);
      switch (type.getBasic()) {
        case Type::i32:
          import = set_i32;
          break;
        case Type::i64:
          return; // TODO
        case Type::f32:
          import = set_f32;
          break;
        case Type::f64:
          import = set_f64;
          break;
        case Type::v128:
          import = set_v128;
          break;
        case Type::unreachable:
          return; // nothing to do here
        case Type::none:
          WASM_UNREACHABLE("unexpected type");
      }
    }
    curr->value = builder.makeCall(import,
                                   {builder.makeConst(int32_t(id++)),
                                    builder.makeConst(int32_t(curr->index)),
                                    curr->value},
                                   curr->value->type);
  }